

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

ssize_t __thiscall Instance::read(Instance *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  Item *this_01;
  pointer piVar1;
  pointer pcVar2;
  short sVar3;
  pointer pIVar4;
  int d;
  int i;
  int iVar5;
  uint uVar6;
  int iVar7;
  runtime_error *this_02;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  pointer pvVar11;
  ulong uVar12;
  undefined4 in_register_00000034;
  undefined8 uVar13;
  long lVar14;
  int t_1;
  pointer pIVar15;
  long lVar16;
  int d_1;
  double dVar17;
  int bi;
  value_type_conflict local_298;
  int local_294;
  pointer local_290;
  undefined8 local_288;
  int local_280;
  allocator_type local_279;
  vector<char,_std::allocator<char>_> *local_278;
  vector<int,_std::allocator<int>_> *local_270;
  int local_264;
  vector<int,_std::allocator<int>_> *local_260;
  int *local_258;
  vector<int,_std::allocator<int>_> *local_250;
  vector<int,_std::allocator<int>_> *local_248;
  vector<Item,_std::allocator<Item>_> *local_240;
  char buf [256];
  int ti;
  
  uVar13 = CONCAT44(in_register_00000034,__fd);
  local_294 = (int)__buf;
  iVar5 = __isoc99_fscanf(uVar13," #INSTANCE_BEGIN#");
  if (iVar5 == 0) {
    iVar5 = __isoc99_fscanf(uVar13," $INSTANCE {");
    if (iVar5 == 0) {
      iVar5 = __isoc99_fscanf(uVar13,"%d",this);
      if (iVar5 == 1) {
        if (this->ndims < 1) {
          snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","ndims >= 1",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                   ,0x6e);
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,buf);
        }
        else {
          piVar8 = &this->nbtypes;
          if (local_294 == 1) {
            iVar5 = __isoc99_fscanf(uVar13,"%d",piVar8);
            if (iVar5 != 1) {
              snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \"%d\", &nbtypes) == 1",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0x71);
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_02,buf);
              goto LAB_00103d2e;
            }
            uVar6 = *piVar8;
            if ((int)uVar6 < 1) {
              snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "nbtypes >= 1",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0x72);
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_02,buf);
              goto LAB_00103d2e;
            }
          }
          else {
            uVar6 = 1;
            *piVar8 = 1;
          }
          this_00 = &this->Ws;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(this_00,(ulong)uVar6);
          local_260 = &this->Cs;
          std::vector<int,_std::allocator<int>_>::resize(local_260,(long)this->nbtypes);
          local_270 = &this->Qs;
          std::vector<int,_std::allocator<int>_>::resize(local_270,(long)this->nbtypes);
          pIVar15 = (pointer)0x0;
          local_288 = uVar13;
          while ((long)pIVar15 < (long)this->nbtypes) {
            local_290 = pIVar15;
            std::vector<int,_std::allocator<int>_>::resize
                      ((this->Ws).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)pIVar15,(long)this->ndims);
            lVar9 = 0;
            lVar16 = 0;
            while (uVar13 = local_288, pIVar4 = local_290, lVar16 < this->ndims) {
              iVar5 = __isoc99_fscanf(local_288,"%d",
                                      *(long *)&(this_00->
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start
                                                [(long)pIVar15].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + lVar9);
              if (iVar5 != 1) {
                snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "fscanf(fin, \"%d\", &Ws[t][d]) == 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0x7d);
                this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_02,buf);
                goto LAB_00103d2e;
              }
              lVar16 = lVar16 + 1;
              piVar8 = (int *)(*(long *)&(this_00->
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[(long)pIVar15].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + lVar9);
              lVar9 = lVar9 + 4;
              if (*piVar8 < 0) {
                snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "Ws[t][d] >= 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0x7e);
                this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_02,buf);
                goto LAB_00103d2e;
              }
            }
            if (local_294 == 1) {
              iVar5 = __isoc99_fscanf(local_288,"%d");
              if (iVar5 != 1) {
                snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "fscanf(fin, \"%d\", &Cs[t]) == 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0x81);
                this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_02,buf);
                goto LAB_00103d2e;
              }
              iVar5 = __isoc99_fscanf(uVar13,"%d",
                                      (local_270->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start + (long)pIVar4);
              if (iVar5 != 1) {
                snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "fscanf(fin, \"%d\", &Qs[t]) == 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0x82);
                this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_02,buf);
                goto LAB_00103d2e;
              }
            }
            else {
              (local_260->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[(long)local_290] = 1;
              (local_270->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[(long)local_290] = -1;
            }
            pIVar15 = (pointer)((long)&(pIVar4->w).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + 1);
          }
          local_240 = &this->items;
          std::vector<Item,_std::allocator<Item>_>::clear(local_240);
          piVar1 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar1) {
            (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar1;
          }
          pcVar2 = (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar2) {
            (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = pcVar2;
          }
          piVar1 = (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar1) {
            (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar1;
          }
          local_258 = &this->m;
          iVar5 = __isoc99_fscanf(uVar13,"%d");
          if (iVar5 == 1) {
            local_248 = &this->nopts;
            local_278 = &this->ctypes;
            local_250 = &this->demands;
            local_270 = (vector<int,_std::allocator<int>_> *)((ulong)local_270 & 0xffffffff00000000)
            ;
            iVar5 = 0;
            while (iVar5 < *local_258) {
              local_280 = iVar5;
              if (local_294 == 1) {
                iVar5 = __isoc99_fscanf(uVar13,"%d",&ti);
                if (iVar5 != 1) {
                  snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \"%d\", &ti) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x92);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,buf);
                  goto LAB_00103d2e;
                }
                if (ti < 0) {
                  snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "ti >= 0",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x93);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,buf);
                  goto LAB_00103d2e;
                }
                iVar5 = __isoc99_fscanf(uVar13,"%d",&bi);
                if (iVar5 != 1) {
                  snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \"%d\", &bi) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x94);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,buf);
                  goto LAB_00103d2e;
                }
                if (bi < 0) {
                  snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "bi >= 0",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x95);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,buf);
                  goto LAB_00103d2e;
                }
                std::vector<int,_std::allocator<int>_>::push_back(local_250,&bi);
              }
              else {
                ti = 1;
                bi = -1;
              }
              std::vector<int,_std::allocator<int>_>::push_back(local_248,&ti);
              buf[0] = '*';
              std::vector<char,_std::allocator<char>_>::emplace_back<char>(local_278,buf);
              local_264 = 0;
              iVar5 = 0;
              while (iVar5 < ti) {
                local_260 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_260._4_4_,iVar5);
                Item::Item((Item *)buf,this->ndims);
                std::vector<Item,_std::allocator<Item>_>::emplace_back<Item>(local_240,(Item *)buf);
                uVar13 = local_288;
                Item::~Item((Item *)buf);
                local_290 = (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                iVar5 = -1;
                if (1 < ti) {
                  iVar5 = (int)local_260;
                }
                this_01 = local_290 + -1;
                local_290[-1].opt = iVar5;
                pIVar15 = local_290 + -1;
                local_298 = 0;
                while( true ) {
                  iVar5 = this->ndims;
                  if (iVar5 <= local_298) break;
                  piVar8 = Item::operator[](this_01,local_298);
                  iVar5 = __isoc99_fscanf(uVar13,"%d",piVar8);
                  if (iVar5 != 1) {
                    snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &item[d]) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0xa9);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,buf);
                    goto LAB_00103d2e;
                  }
                  piVar8 = Item::operator[](this_01,local_298);
                  if (*piVar8 < 0) {
                    snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "item[d] >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0xaa);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,buf);
                    goto LAB_00103d2e;
                  }
                  piVar8 = Item::operator[](this_01,local_298);
                  if (*piVar8 != 0) {
                    std::vector<int,_std::allocator<int>_>::push_back(&pIVar15->nonzero,&local_298);
                  }
                  local_298 = local_298 + 1;
                }
                if (local_290[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    local_290[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "!item.nonzero.empty()",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0xaf);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,buf);
                  goto LAB_00103d2e;
                }
                if (local_294 == 0) {
                  iVar5 = __isoc99_fscanf(uVar13,"%d",&bi);
                  if (iVar5 != 1) {
                    snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &bi) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0xb2);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,buf);
                    goto LAB_00103d2e;
                  }
                  if (bi < 0) {
                    snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "bi >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0xb3);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,buf);
                    goto LAB_00103d2e;
                  }
                  std::vector<int,_std::allocator<int>_>::push_back(local_250,&bi);
                  iVar5 = this->ndims;
                }
                local_290[-1].demand = bi;
                local_298 = 0;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)buf,(long)iVar5,&local_298,
                           &local_279);
                for (lVar9 = 0; uVar10 = (ulong)this->ndims, lVar9 < (long)uVar10; lVar9 = lVar9 + 1
                    ) {
                  lVar16 = CONCAT62(buf._2_6_,CONCAT11(buf[1],buf[0]));
                  pvVar11 = (this_00->
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  for (lVar14 = 0; lVar14 < this->nbtypes; lVar14 = lVar14 + 1) {
                    iVar5 = *(int *)(lVar16 + lVar9 * 4);
                    iVar7 = *(int *)(*(long *)&(pvVar11->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data + lVar9 * 4);
                    if (iVar7 < iVar5) {
                      iVar7 = iVar5;
                    }
                    *(int *)(lVar16 + lVar9 * 4) = iVar7;
                    pvVar11 = pvVar11 + 1;
                  }
                }
                iVar5 = 0;
                for (lVar9 = 0; lVar9 < (int)uVar10; lVar9 = lVar9 + 1) {
                  if (0 < *(int *)(CONCAT62(buf._2_6_,CONCAT11(buf[1],buf[0])) + lVar9 * 4)) {
                    piVar8 = Item::operator[](this_01,(int)lVar9);
                    dVar17 = round(((double)*piVar8 /
                                   (double)*(int *)(CONCAT62(buf._2_6_,CONCAT11(buf[1],buf[0])) +
                                                   lVar9 * 4)) * 10000.0);
                    iVar5 = (int)((double)iVar5 + dVar17);
                    uVar10 = (ulong)(uint)this->ndims;
                  }
                }
                if (0 < local_290[-1].demand) {
                  for (lVar9 = 0; lVar9 < this->nbtypes; lVar9 = lVar9 + 1) {
                    lVar16 = 0;
                    do {
                      if (this->ndims <= lVar16) {
                        iVar7 = 1;
                        goto LAB_001038e7;
                      }
                      piVar8 = Item::operator[](this_01,(int)lVar16);
                      lVar14 = lVar16 * 4;
                      lVar16 = lVar16 + 1;
                    } while (*piVar8 <=
                             *(int *)(*(long *)&(this_00->
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[lVar9].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + lVar14));
                  }
                  iVar7 = 0;
LAB_001038e7:
                  local_264 = local_264 + iVar7;
                }
                local_290[-1].key = iVar5;
                local_290[-1].type = local_280;
                local_290[-1].id = (int)local_270;
                local_270 = (vector<int,_std::allocator<int>_> *)
                            CONCAT44(local_270._4_4_,(int)local_270 + 1);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)buf);
                iVar5 = (int)local_260 + 1;
              }
              if (local_264 < 1 && 0 < bi) {
                snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "nfits >= 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0xda);
                this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_02,buf);
                goto LAB_00103d2e;
              }
              uVar13 = local_288;
              iVar5 = local_280 + 1;
            }
            iVar5 = __isoc99_fscanf(uVar13," } ;");
            if (iVar5 < 1) {
              local_290 = (pointer)&this->method;
              pIVar15 = local_290;
              do {
                while( true ) {
                  iVar5 = __isoc99_fscanf(uVar13," $%[^{ \n]",buf);
                  if (iVar5 != 1) {
                    iVar5 = __isoc99_fscanf(uVar13);
                    if (iVar5 < 1) {
                      for (lVar9 = 0; uVar6 = *local_258, lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
                        pcVar2 = (local_278->super__Vector_base<char,_std::allocator<char>_>).
                                 _M_impl.super__Vector_impl_data._M_start;
                        if (pcVar2[lVar9] == '*') {
                          pcVar2[lVar9] =
                               '>' - ((local_250->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start[lVar9] < 2);
                        }
                      }
                      this->n = 0;
                      piVar1 = (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start;
                      uVar12 = 0;
                      uVar10 = (ulong)uVar6;
                      if ((int)uVar6 < 1) {
                        uVar10 = uVar12;
                      }
                      iVar5 = 0;
                      for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
                        iVar5 = iVar5 + piVar1[uVar12];
                        this->n = iVar5;
                      }
                      lVar9 = ((long)(this->items).super__Vector_base<Item,_std::allocator<Item>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->items).super__Vector_base<Item,_std::allocator<Item>_>.
                                    _M_impl.super__Vector_impl_data._M_start) / 0x48;
                      this->nsizes = (int)lVar9;
                      return lVar9;
                    }
                    snprintf((char *)&ti,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \" #INSTANCE_END#\") <= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x107);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,(char *)&ti);
                    goto LAB_00103d2e;
                  }
                  iVar5 = bcmp(buf,"VTYPE",6);
                  if (iVar5 == 0) break;
                  iVar5 = bcmp(buf,"CTYPE",6);
                  if (iVar5 == 0) {
                    iVar5 = __isoc99_fscanf(uVar13," {");
                    if (iVar5 != 0) {
                      snprintf((char *)&ti,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" {\") == 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xe6);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)&ti);
                      goto LAB_00103d2e;
                    }
                    pcVar2 = (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if ((this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish != pcVar2) {
                      (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish = pcVar2;
                    }
                    for (iVar5 = 0; uVar13 = local_288, iVar5 < *local_258; iVar5 = iVar5 + 1) {
                      if (iVar5 != 0) {
                        iVar7 = __isoc99_fscanf(local_288," ,");
                        if (iVar7 != 0) {
                          snprintf((char *)&ti,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" ,\") == 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xe9);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)&ti);
                          goto LAB_00103d2e;
                        }
                      }
                      iVar7 = __isoc99_fscanf(uVar13," %[^}, \n]",buf);
                      if (iVar7 != 1) {
                        snprintf((char *)&ti,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                 "fscanf(fin, \" %[^}, \\n]\", buf) == 1",
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                 ,0xea);
                        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_02,(char *)&ti);
                        goto LAB_00103d2e;
                      }
                      sVar3 = CONCAT11(buf[1],buf[0]);
                      if (sVar3 == 0x2a) {
                        ti = CONCAT31(ti._1_3_,0x2a);
                      }
                      else if (sVar3 == 0x3d) {
                        ti = CONCAT31(ti._1_3_,0x3d);
                      }
                      else {
                        if (sVar3 != 0x3e) {
                          snprintf((char *)&ti,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "!strcmp(buf, \"*\")",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xf0);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)&ti);
                          goto LAB_00103d2e;
                        }
                        ti = CONCAT31(ti._1_3_,0x3e);
                      }
                      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                                (local_278,(char *)&ti);
                    }
                    iVar5 = __isoc99_fscanf(local_288," } ;");
                    pIVar15 = local_290;
                    if (iVar5 != 0) {
                      snprintf((char *)&ti,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" } ;\") == 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xf4);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)&ti);
                      goto LAB_00103d2e;
                    }
                  }
                  else {
                    iVar5 = bcmp(buf,"METHOD",7);
                    if (iVar5 == 0) {
                      iVar5 = __isoc99_fscanf(uVar13," { %d } ;",pIVar15);
                      if (iVar5 != 1) {
                        snprintf((char *)&ti,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                 "fscanf(fin, \" { %d } ;\", &method) == 1",
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                 ,0xf6);
                        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_02,(char *)&ti);
                        goto LAB_00103d2e;
                      }
                      if (*(int *)&(pIVar15->w).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start != -3) {
                        snprintf((char *)&ti,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                 "method >= MIN_METHOD && method <= MAX_METHOD",
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                 ,0xf7);
                        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_02,(char *)&ti);
                        goto LAB_00103d2e;
                      }
                    }
                    else {
                      iVar5 = bcmp(buf,"RELAX",6);
                      if (iVar5 == 0) {
                        bi = 0;
                        iVar5 = __isoc99_fscanf(uVar13," { %d } ;",&bi);
                        if (iVar5 != 1) {
                          snprintf((char *)&ti,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" { %d } ;\", &trelax) == 1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xfa);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)&ti);
                          goto LAB_00103d2e;
                        }
                        if (1 < (uint)bi) {
                          snprintf((char *)&ti,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "trelax == 0 || trelax == 1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xfb);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)&ti);
                          goto LAB_00103d2e;
                        }
                        this->relax_domains = SUB41(bi,0);
                      }
                      else {
                        iVar5 = bcmp(buf,"BINARY",7);
                        if (iVar5 != 0) {
                          printf("Invalid option \'%s\'!\n",buf);
                          exit(1);
                        }
                        bi = 0;
                        iVar5 = __isoc99_fscanf(uVar13," { %d } ;",&bi);
                        if (iVar5 != 1) {
                          snprintf((char *)&ti,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" { %d } ;\", &tbinary) == 1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xff);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)&ti);
                          goto LAB_00103d2e;
                        }
                        if (1 < (uint)bi) {
                          snprintf((char *)&ti,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "tbinary == 0 || tbinary == 1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0x100);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)&ti);
                          goto LAB_00103d2e;
                        }
                        this->binary = SUB41(bi,0);
                      }
                    }
                  }
                }
                iVar5 = __isoc99_fscanf(uVar13," { %[^}, \n] } ;",buf);
                if (iVar5 != 1) {
                  snprintf((char *)&ti,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \" { %[^}, \\n] } ;\", buf) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0xe2);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,(char *)&ti);
                  goto LAB_00103d2e;
                }
                this->vtype = buf[0];
              } while ((buf[0] == 'C') || (buf[0] == 'I'));
              snprintf((char *)&ti,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "vtype == \'C\' || vtype == \'I\'",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0xe4);
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_02,(char *)&ti);
            }
            else {
              snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" } ;\") <= 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0xdd);
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_02,buf);
            }
          }
          else {
            snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                     "fscanf(fin, \"%d\", &m) == 1",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                     ,0x8e);
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_02,buf);
          }
        }
      }
      else {
        snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \"%d\", &ndims) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x6d);
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,buf);
      }
    }
    else {
      snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" $INSTANCE {\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
               ,0x6c);
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,buf);
    }
  }
  else {
    snprintf(buf,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" #INSTANCE_BEGIN#\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x6b);
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,buf);
  }
LAB_00103d2e:
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Instance::read(FILE *fin, ftype type) {
	throw_assert(fscanf(fin, " #INSTANCE_BEGIN#") == 0);
	throw_assert(fscanf(fin, " $INSTANCE {") == 0);
	throw_assert(fscanf(fin, "%d", &ndims) == 1);
	throw_assert(ndims >= 1);

	if (type == MVP) {
		throw_assert(fscanf(fin, "%d", &nbtypes) == 1);
		throw_assert(nbtypes >= 1);
	} else {
		nbtypes = 1;
	}

	Ws.resize(nbtypes);
	Cs.resize(nbtypes);
	Qs.resize(nbtypes);
	for (int t = 0; t < nbtypes; t++) {
		Ws[t].resize(ndims);
		for (int d = 0; d < ndims; d++) {
			throw_assert(fscanf(fin, "%d", &Ws[t][d]) == 1);
			throw_assert(Ws[t][d] >= 0);
		}
		if (type == MVP) {
			throw_assert(fscanf(fin, "%d", &Cs[t]) == 1);
			throw_assert(fscanf(fin, "%d", &Qs[t]) == 1);
		} else {
			Cs[t] = 1;
			Qs[t] = -1;
		}
	}

	items.clear();
	nopts.clear();
	ctypes.clear();
	demands.clear();
	int it_count = 0;
	throw_assert(fscanf(fin, "%d", &m) == 1);
	for (int it_type = 0; it_type < m; it_type++) {
		int ti, bi;
		if (type == MVP) {
			throw_assert(fscanf(fin, "%d", &ti) == 1);
			throw_assert(ti >= 0);
			throw_assert(fscanf(fin, "%d", &bi) == 1);
			throw_assert(bi >= 0);
			demands.push_back(bi);
		} else {
			ti = 1;
			bi = -1;
		}
		nopts.push_back(ti);
		ctypes.push_back('*');

		int nfits = 0;
		for (int opt = 0; opt < ti; opt++) {
			items.push_back(Item(ndims));
			Item &item = items.back();
			if (ti > 1) {
				item.opt = opt;
			} else {
				item.opt = -1;
			}

			for (int d = 0; d < ndims; d++) {
				throw_assert(fscanf(fin, "%d", &item[d]) == 1);
				throw_assert(item[d] >= 0);
				if (item[d] != 0) {
					item.nonzero.push_back(d);
				}
			}
			throw_assert(!item.nonzero.empty());

			if (type == VBP) {
				throw_assert(fscanf(fin, "%d", &bi) == 1);
				throw_assert(bi >= 0);
				demands.push_back(bi);
			}
			item.demand = bi;

			int S = 0;
			std::vector<int> maxW(ndims, 0);
			for (int d = 0; d < ndims; d++) {
				for (int t = 0; t < nbtypes; t++) {
					maxW[d] = std::max(maxW[d], Ws[t][d]);
				}
			}
			for (int d = 0; d < ndims; d++) {
				if (maxW[d] > 0) {
					S += round(
							item[d] / static_cast<double>(maxW[d]) * NORM_PRECISION);
				}
			}
			if (item.demand > 0) {
				bool fits = false;
				for (int t = 0; t < nbtypes; t++) {
					fits = true;
					for (int d = 0; d < ndims; d++) {
						if (item[d] > Ws[t][d]) {
							fits = false;
							break;
						}
					}
					if (fits) {
						break;
					}
				}
				nfits += fits;
			}
			item.key = S;
			item.type = it_type;
			item.id = it_count++;
		}
		if (bi > 0) {
			throw_assert(nfits >= 1);
		}
	}
	throw_assert(fscanf(fin, " } ;") <= 0);

	char buf[MAX_LEN];
	while (fscanf(fin, " $%[^{ \n]", buf) == 1) {
		if (!strcmp(buf, "VTYPE")) {
			throw_assert(fscanf(fin, " { %[^}, \n] } ;", buf) == 1);
			vtype = buf[0];
			throw_assert(vtype == 'C' || vtype == 'I');
		} else if (!strcmp(buf, "CTYPE")) {
			throw_assert(fscanf(fin, " {") == 0);
			ctypes.clear();
			for (int i = 0; i < m; i++) {
				if (i) throw_assert(fscanf(fin, " ,") == 0);
				throw_assert(fscanf(fin, " %[^}, \n]", buf) == 1);
				if (!strcmp(buf, ">")) {
					ctypes.push_back('>');
				} else if (!strcmp(buf, "=")) {
					ctypes.push_back('=');
				} else {
					throw_assert(!strcmp(buf, "*"));
					ctypes.push_back('*');
				}
			}
			throw_assert(fscanf(fin, " } ;") == 0);
		} else if (!strcmp(buf, "METHOD")) {
			throw_assert(fscanf(fin, " { %d } ;", &method) == 1);
			throw_assert(method >= MIN_METHOD && method <= MAX_METHOD);
		} else if (!strcmp(buf, "RELAX")) {
			int trelax = 0;
			throw_assert(fscanf(fin, " { %d } ;", &trelax) == 1);
			throw_assert(trelax == 0 || trelax == 1);
			relax_domains = trelax;
		} else if (!strcmp(buf, "BINARY")) {
			int tbinary = 0;
			throw_assert(fscanf(fin, " { %d } ;", &tbinary) == 1);
			throw_assert(tbinary == 0 || tbinary == 1);
			binary = tbinary;
		} else {
			printf("Invalid option '%s'!\n", buf);
			exit(1);
		}
	}
	throw_assert(fscanf(fin, " #INSTANCE_END#") <= 0);

	for (int i = 0; i < m; i++) {
		if (ctypes[i] == '*') {
			ctypes[i] = (demands[i] <= 1) ? '=' : '>';
		}
	}

	n = 0;
	for (int i = 0; i < m; i++) {
		n += demands[i];
	}

	nsizes = items.size();
}